

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

stbi_uc * stbi__hdr_to_ldr(float *data,int x,int y,int comp)

{
  uint uVar1;
  stbi_uc *psVar2;
  long lVar3;
  uint uVar4;
  stbi_uc *psVar5;
  float *pfVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  float fVar10;
  float fVar11;
  
  uVar4 = x * y;
  psVar2 = (stbi_uc *)malloc((long)(int)(uVar4 * comp));
  if (psVar2 == (stbi_uc *)0x0) {
    free(data);
    stbi__g_failure_reason = "Out of memory";
    psVar2 = (stbi_uc *)0x0;
  }
  else {
    if (0 < (int)uVar4) {
      uVar1 = ((comp & 1U) + comp) - 1;
      lVar7 = (long)comp;
      uVar8 = 0;
      psVar5 = psVar2;
      pfVar6 = data;
      do {
        uVar9 = 0;
        if (0 < (int)uVar1) {
          uVar9 = 0;
          do {
            fVar10 = powf(pfVar6[uVar9] * stbi__h2l_scale_i,stbi__h2l_gamma_i);
            fVar11 = fVar10 * 255.0 + 0.5;
            fVar10 = 0.0;
            if (0.0 <= fVar11) {
              fVar10 = fVar11;
            }
            fVar11 = 255.0;
            if (fVar10 <= 255.0) {
              fVar11 = fVar10;
            }
            psVar5[uVar9] = (stbi_uc)(int)fVar11;
            uVar9 = uVar9 + 1;
          } while (uVar1 != uVar9);
        }
        if ((int)uVar9 < comp) {
          lVar3 = (long)(int)uVar9 + uVar8 * lVar7;
          fVar11 = data[lVar3] * 255.0 + 0.5;
          fVar10 = 0.0;
          if (0.0 <= fVar11) {
            fVar10 = fVar11;
          }
          fVar11 = 255.0;
          if (fVar10 <= 255.0) {
            fVar11 = fVar10;
          }
          psVar2[lVar3] = (stbi_uc)(int)fVar11;
        }
        uVar8 = uVar8 + 1;
        pfVar6 = pfVar6 + lVar7;
        psVar5 = psVar5 + lVar7;
      } while (uVar8 != uVar4);
    }
    free(data);
  }
  return psVar2;
}

Assistant:

static stbi_uc *stbi__hdr_to_ldr(float   *data, int x, int y, int comp)
{
   int i,k,n;
   stbi_uc *output = (stbi_uc *) stbi__malloc(x * y * comp);
   if (output == NULL) { STBI_FREE(data); return stbi__errpuc("outofmem", "Out of memory"); }
   // compute number of non-alpha components
   if (comp & 1) n = comp; else n = comp-1;
   for (i=0; i < x*y; ++i) {
      for (k=0; k < n; ++k) {
         float z = (float) pow(data[i*comp+k]*stbi__h2l_scale_i, stbi__h2l_gamma_i) * 255 + 0.5f;
         if (z < 0) z = 0;
         if (z > 255) z = 255;
         output[i*comp + k] = (stbi_uc) stbi__float2int(z);
      }
      if (k < comp) {
         float z = data[i*comp+k] * 255 + 0.5f;
         if (z < 0) z = 0;
         if (z > 255) z = 255;
         output[i*comp + k] = (stbi_uc) stbi__float2int(z);
      }
   }
   STBI_FREE(data);
   return output;
}